

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::fill<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> it,size_t n,basic_specs *specs)

{
  size_t sVar1;
  char *pcVar2;
  basic_specs *in_RDX;
  ulong in_RSI;
  buffer<char> *in_RDI;
  size_t i;
  char *data;
  size_t fill_size;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  unsigned_long in_stack_ffffffffffffffb0;
  basic_appender<char> in_stack_ffffffffffffffb8;
  ulong uVar3;
  undefined8 local_10;
  undefined8 local_8;
  
  sVar1 = basic_specs::fill_size(in_RDX);
  if (sVar1 == 1) {
    basic_specs::fill_unit<char>(in_RDX);
    local_8 = fill_n<fmt::v11::basic_appender<char>,unsigned_long,char>
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
  }
  else {
    pcVar2 = basic_specs::fill<char,_0>(in_RDX);
    local_10 = in_RDI;
    if (pcVar2 != (char *)0x0) {
      for (uVar3 = 0; uVar3 < in_RSI; uVar3 = uVar3 + 1) {
        local_10 = copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                             (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,local_10);
      }
    }
    local_8 = local_10;
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const basic_specs& specs) -> OutputIt {
  auto fill_size = specs.fill_size();
  if (fill_size == 1) return detail::fill_n(it, n, specs.fill_unit<Char>());
  if (const Char* data = specs.fill<Char>()) {
    for (size_t i = 0; i < n; ++i) it = copy<Char>(data, data + fill_size, it);
  }
  return it;
}